

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall HighsLpRelaxation::performAging(HighsLpRelaxation *this,bool deleteRows)

{
  double *pdVar1;
  HighsInfo *pHVar2;
  pointer pHVar3;
  HighsSolution *pHVar4;
  int *piVar5;
  HighsBasis *this_00;
  const_reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  HighsOptions *pHVar9;
  byte in_SIL;
  long *in_RDI;
  vector<double,_std::allocator<double>_> *this_01;
  double extraout_XMM0_Qa;
  HighsInt i;
  HighsInt ndelcuts;
  vector<int,_std::allocator<int>_> deletemask;
  HighsInt nummodelrows;
  HighsInt nlprows;
  HighsInt agelimit;
  HighsCutPool *in_stack_ffffffffffffff80;
  uint uVar10;
  uint in_stack_ffffffffffffff8c;
  ulong in_stack_ffffffffffffff98;
  HighsCutPool *this_02;
  HighsInt local_40;
  int local_3c;
  vector<int,_std::allocator<int>_> local_38;
  HighsInt local_20;
  HighsInt local_1c;
  int local_18;
  int local_14;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  pHVar2 = Highs::getInfo((Highs *)(in_RDI + 1));
  if ((pHVar2->super_HighsInfoStruct).basis_validity != 0) {
    pHVar2 = Highs::getInfo((Highs *)(in_RDI + 1));
    this_02 = (HighsCutPool *)(pHVar2->super_HighsInfoStruct).max_dual_infeasibility;
    pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6064b7);
    if (((double)this_02 < pHVar3->feastol || (double)this_02 == pHVar3->feastol) &&
       (pHVar4 = Highs::getSolution((Highs *)(in_RDI + 1)), (pHVar4->dual_valid & 1U) != 0)) {
      if ((local_9 & 1) == 0) {
        if (in_RDI[0xa71] == in_RDI[0xa70]) {
          return;
        }
        local_10 = 0x7fffffff;
      }
      else {
        local_10 = *(int *)(*(long *)(*in_RDI + 8) + 0x310);
        in_RDI[0xa74] = in_RDI[0xa74] + 1;
        in_stack_ffffffffffffff98 = in_RDI[0xa74];
        local_14 = local_10 >> 1;
        local_18 = 2;
        piVar5 = std::max<int>(&local_14,&local_18);
        if (in_stack_ffffffffffffff98 % (ulong)(long)*piVar5 == 0) {
          if ((int)in_RDI[0xa74] < local_10) {
            local_10 = (int)in_RDI[0xa74];
          }
        }
        else {
          local_10 = 0x7fffffff;
        }
      }
      in_RDI[0xa71] = in_RDI[0xa70];
      local_1c = numRows((HighsLpRelaxation *)0x6065e1);
      local_20 = getNumModelRows((HighsLpRelaxation *)0x6065ef);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x6065fd);
      local_3c = 0;
      for (local_40 = local_20; local_40 != local_1c; local_40 = local_40 + 1) {
        this_00 = Highs::getBasis((Highs *)(in_RDI + 1));
        pvVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&this_00->row_status,(long)local_40);
        if (*pvVar6 == kBasic) {
          in_stack_ffffffffffffff8c = CONCAT13(1,(int3)in_stack_ffffffffffffff8c);
          if ((local_9 & 1) == 0) {
            pvVar7 = std::
                     vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::
                     operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                                 *)(in_RDI + 0xa39),(long)local_40);
            in_stack_ffffffffffffff8c = CONCAT13(pvVar7->age != 0,(int3)in_stack_ffffffffffffff8c);
          }
          uVar10 = in_stack_ffffffffffffff8c >> 0x18;
          pvVar7 = std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                   ::operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                                 *)(in_RDI + 0xa39),(long)local_40);
          pvVar7->age = uVar10 + pvVar7->age;
          pvVar7 = std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                   ::operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                                 *)(in_RDI + 0xa39),(long)local_40);
          if (local_10 < pvVar7->age) {
            if (local_3c == 0) {
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)this_00,
                         CONCAT44(in_stack_ffffffffffffff8c,uVar10));
            }
            local_3c = local_3c + 1;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,(long)local_40);
            *pvVar8 = 1;
            pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x60673d);
            in_stack_ffffffffffffff80 = &pHVar3->cutpool;
            std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::
            operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                        *)(in_RDI + 0xa39),(long)local_40);
            HighsCutPool::lpCutRemoved(this_02,(HighsInt)(in_stack_ffffffffffffff98 >> 0x20));
          }
        }
        else {
          pHVar4 = Highs::getSolution((Highs *)(in_RDI + 1));
          this_01 = &pHVar4->row_dual;
          std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)local_40);
          std::abs((int)this_01);
          pHVar9 = Highs::getOptions((Highs *)(in_RDI + 1));
          pdVar1 = &(pHVar9->super_HighsOptionsStruct).dual_feasibility_tolerance;
          if (*pdVar1 <= extraout_XMM0_Qa && extraout_XMM0_Qa != *pdVar1) {
            pvVar7 = std::
                     vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::
                     operator[]((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                                 *)(in_RDI + 0xa39),(long)local_40);
            pvVar7->age = 0;
          }
        }
      }
      removeCuts((HighsLpRelaxation *)
                 deletemask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 deletemask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 (vector<int,_std::allocator<int>_> *)
                 deletemask.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80);
    }
  }
  return;
}

Assistant:

void HighsLpRelaxation::performAging(bool deleteRows) {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  HighsInt agelimit;

  if (lpsolver.getInfo().basis_validity == kBasisValidityInvalid ||
      lpsolver.getInfo().max_dual_infeasibility > mipsolver.mipdata_->feastol ||
      !lpsolver.getSolution().dual_valid)
    return;

  if (deleteRows) {
    agelimit = mipsolver.options_mip_->mip_lp_age_limit;

    ++epochs;
    if (epochs % std::max(agelimit >> 1, HighsInt{2}) != 0)
      agelimit = kHighsIInf;
    else if ((HighsInt)epochs < agelimit)
      agelimit = epochs;
  } else {
    if (lastAgeCall == numlpiters) return;
    agelimit = kHighsIInf;
  }

  lastAgeCall = numlpiters;

  HighsInt nlprows = numRows();
  HighsInt nummodelrows = getNumModelRows();
  std::vector<HighsInt> deletemask;

  HighsInt ndelcuts = 0;
  for (HighsInt i = nummodelrows; i != nlprows; ++i) {
    assert(lprows[i].origin == LpRow::Origin::kCutPool);
    if (lpsolver.getBasis().row_status[i] == HighsBasisStatus::kBasic) {
      lprows[i].age += (deleteRows || lprows[i].age != 0);
      if (lprows[i].age > agelimit) {
        if (ndelcuts == 0) deletemask.resize(nlprows);
        ++ndelcuts;
        deletemask[i] = 1;
        mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
      }
    } else if (std::abs(lpsolver.getSolution().row_dual[i]) >
               lpsolver.getOptions().dual_feasibility_tolerance) {
      lprows[i].age = 0;
    }
  }

  removeCuts(ndelcuts, deletemask);
}